

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O2

void __thiscall HEkkDual::updateFtranBFRT(HEkkDual *this)

{
  HVector *bfrtColumn;
  int iVar1;
  HighsSimplexAnalysis *this_00;
  
  if (this->rebuild_reason != 0) {
    return;
  }
  iVar1 = (this->dualRow).workCount;
  if (0 < iVar1) {
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x47,0);
  }
  bfrtColumn = &this->col_BFRT;
  HEkkDualRow::updateFlip(&this->dualRow,bfrtColumn);
  if ((this->col_BFRT).count != 0) {
    this_00 = this->analysis;
    if (this_00->analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::operationRecordBefore
                (this_00,7,bfrtColumn,(this->ekk_instance_->info_).col_BFRT_density);
      this_00 = this->analysis;
    }
    HSimplexNla::ftran(this->simplex_nla,bfrtColumn,(this->ekk_instance_->info_).col_BFRT_density,
                       this_00->pointer_serial_factor_clocks);
    if (this->analysis->analyse_simplex_summary_data == true) {
      HighsSimplexAnalysis::operationRecordAfter(this->analysis,7,bfrtColumn);
    }
  }
  if (0 < iVar1) {
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x47,0);
  }
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)(this->col_BFRT).count * this->inv_solver_num_row,
             &(this->ekk_instance_->info_).col_BFRT_density);
  return;
}

Assistant:

void HEkkDual::updateFtranBFRT() {
  // Compute the RHS changes corresponding to the BFRT (FTRAN-BFRT)
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  // Only time updateFtranBFRT if dualRow.workCount > 0;
  // If dualRow.workCount = 0 then dualRow.updateFlip(&col_BFRT)
  // merely clears col_BFRT so no FTRAN is performed
  bool time_updateFtranBFRT = dualRow.workCount > 0;

  if (time_updateFtranBFRT) {
    analysis->simplexTimerStart(FtranBfrtClock);
  }

  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "Before
  //  update_flip");
  dualRow.updateFlip(&col_BFRT);
  //  debugUpdatedObjectiveValue(ekk_instance_, algorithm, solve_phase, "After
  //  update_flip");

  if (col_BFRT.count) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT,
                                      ekk_instance_.info_.col_BFRT_density);
    simplex_nla->ftran(col_BFRT, ekk_instance_.info_.col_BFRT_density,
                       analysis->pointer_serial_factor_clocks);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT);
  }
  if (time_updateFtranBFRT) {
    analysis->simplexTimerStop(FtranBfrtClock);
  }
  const double local_col_BFRT_density =
      (double)col_BFRT.count * inv_solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_BFRT_density, ekk_instance_.info_.col_BFRT_density);
}